

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::compute::makeComputePipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipelineLayout pipelineLayout,VkShaderModule shaderModule)

{
  VkComputePipelineCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_68.stage.pNext = (void *)0x0;
  local_68.stage.flags = 0;
  local_68.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
  local_68.stage.pName = "main";
  local_68.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_68.basePipelineHandle.m_internal = 0;
  local_68.basePipelineIndex = 0;
  local_68.stage.module.m_internal = shaderModule.m_internal;
  local_68.layout.m_internal = pipelineLayout.m_internal;
  ::vk::createComputePipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)0x0,&local_68,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> makeComputePipeline (const DeviceInterface&	vk,
									  const VkDevice			device,
									  const VkPipelineLayout	pipelineLayout,
									  const VkShaderModule		shaderModule)
{
	const VkPipelineShaderStageCreateInfo pipelineShaderStageParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0u,														// VkPipelineShaderStageCreateFlags		flags;
		VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
		shaderModule,											// VkShaderModule						module;
		"main",													// const char*							pName;
		DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
	};
	const VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,		// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0u,													// VkPipelineCreateFlags			flags;
		pipelineShaderStageParams,							// VkPipelineShaderStageCreateInfo	stage;
		pipelineLayout,										// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	return createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo);
}